

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::anon_unknown_0::WriteSimpleBlock(IMkvWriter *writer,Frame *frame,int64 timecode)

{
  int32 iVar1;
  int iVar2;
  int32 iVar3;
  uint64_t uVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  long lVar7;
  Frame *in_RSI;
  IMkvWriter *in_RDI;
  uint64 flags;
  int32 size;
  uint64 in_stack_ffffffffffffffb0;
  IMkvWriter *in_stack_ffffffffffffffb8;
  uint64 in_stack_ffffffffffffffc0;
  IMkvWriter *in_stack_ffffffffffffffc8;
  IMkvWriter *writer_00;
  uint64 local_8;
  
  iVar1 = WriteID(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (iVar1 == 0) {
    uVar4 = Frame::length(in_RSI);
    iVar1 = WriteUInt(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (iVar1 == 0) {
      writer_00 = in_RDI;
      Frame::track_number(in_RSI);
      iVar1 = WriteUInt(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      iVar3 = (int32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (iVar1 == 0) {
        iVar1 = SerializeInt(writer_00,in_stack_ffffffffffffffc0,iVar3);
        if (iVar1 == 0) {
          Frame::is_key(in_RSI);
          iVar1 = SerializeInt(writer_00,in_stack_ffffffffffffffc0,iVar3);
          if (iVar1 == 0) {
            puVar5 = Frame::frame(in_RSI);
            uVar6 = Frame::length(in_RSI);
            iVar2 = (**in_RDI->_vptr_IMkvWriter)(in_RDI,puVar5,uVar6 & 0xffffffff);
            if (iVar2 == 0) {
              iVar1 = GetUIntSize(0xa3);
              iVar3 = GetCodedUIntSize((long)((int)uVar4 + 4));
              lVar7 = (long)(iVar1 + iVar3 + 4);
              uVar4 = Frame::length(in_RSI);
              local_8 = lVar7 + uVar4;
            }
            else {
              local_8 = 0;
            }
          }
          else {
            local_8 = 0;
          }
        }
        else {
          local_8 = 0;
        }
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64 WriteSimpleBlock(IMkvWriter* writer, const Frame* const frame,
                        int64 timecode) {
  if (WriteID(writer, libwebm::kMkvSimpleBlock))
    return 0;

  const int32 size = static_cast<int32>(frame->length()) + 4;
  if (WriteUInt(writer, size))
    return 0;

  if (WriteUInt(writer, static_cast<uint64>(frame->track_number())))
    return 0;

  if (SerializeInt(writer, timecode, 2))
    return 0;

  uint64 flags = 0;
  if (frame->is_key())
    flags |= 0x80;

  if (SerializeInt(writer, flags, 1))
    return 0;

  if (writer->Write(frame->frame(), static_cast<uint32>(frame->length())))
    return 0;

  return GetUIntSize(libwebm::kMkvSimpleBlock) + GetCodedUIntSize(size) + 4 +
         frame->length();
}